

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_graph.cpp
# Opt level: O2

Read<signed_char> __thiscall
Omega_h::map_onto<signed_char>
          (Omega_h *this,Read<signed_char> *a_data,Graph *a2b,LO nb,char init_val,Int width)

{
  void *extraout_RDX;
  Read<signed_char> RVar1;
  Write<signed_char> out;
  allocator local_b1;
  Write<signed_char> local_b0;
  Write<signed_char> local_a0;
  Write<signed_char> local_90;
  Write<signed_char> local_80;
  Graph local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_b1);
  Write<signed_char>::Write(&local_b0,nb * width,init_val,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  Write<signed_char>::Write(&local_80,&a_data->write_);
  Graph::Graph(&local_70,a2b);
  Write<signed_char>::Write(&local_90,&local_b0);
  map_into<signed_char>((Read<signed_char> *)&local_80,&local_70,&local_90,width);
  Write<signed_char>::~Write(&local_90);
  Graph::~Graph(&local_70);
  Write<signed_char>::~Write(&local_80);
  Write<signed_char>::Write(&local_a0,&local_b0);
  Read<signed_char>::Read((Read<signed_char> *)this,&local_a0);
  Write<signed_char>::~Write(&local_a0);
  Write<signed_char>::~Write(&local_b0);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<signed_char>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> map_onto(Read<T> a_data, Graph a2b, LO nb, T init_val, Int width) {
  auto out = Write<T>(nb * width, init_val);
  map_into(a_data, a2b, out, width);
  return out;
}